

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

wchar_t terminal_set_arrow(EditLine *el,wchar_t *name,keymacro_value_t *fun,wchar_t type)

{
  funckey_t *pfVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  pfVar1 = (el->el_terminal).t_fkey;
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    if (lVar4 + 0x20 == 0x100) {
      return L'\xffffffff';
    }
    iVar3 = wcscmp(name,*(wchar_t **)((long)&pfVar1->name + lVar4));
    lVar2 = lVar4 + 0x20;
  } while (iVar3 != 0);
  *(keymacro_value_t *)((long)&pfVar1->fun + lVar4) = *fun;
  *(wchar_t *)((long)&pfVar1->type + lVar4) = type;
  return L'\0';
}

Assistant:

libedit_private int
terminal_set_arrow(EditLine *el, const wchar_t *name, keymacro_value_t *fun,
    int type)
{
	funckey_t *arrow = el->el_terminal.t_fkey;
	int i;

	for (i = 0; i < A_K_NKEYS; i++)
		if (wcscmp(name, arrow[i].name) == 0) {
			arrow[i].fun = *fun;
			arrow[i].type = type;
			return 0;
		}
	return -1;
}